

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlk.cpp
# Opt level: O3

int __thiscall
pg::ZLKSolver::attractPar
          (ZLKSolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int i,int r,
          vector<int,_std::allocator<int>_> *R)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Worker *pWVar5;
  iterator __position;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  uint uVar9;
  ostream *poVar10;
  uint uVar11;
  undefined8 *puVar12;
  ulong uVar13;
  int iVar14;
  size_type __n;
  uint uVar15;
  int *piVar16;
  TD_attractParT *t;
  Task *pTVar17;
  long lVar18;
  bool bVar19;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  ulong local_50;
  undefined1 auVar20 [32];
  
  uVar1 = ((this->super_Solver).game)->_priority[i];
  uVar9 = lace_workers();
  if (0 < (int)uVar9) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar13 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar8 = vpcmpuq_avx512f(auVar24,auVar23,2);
      auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pvec + uVar13 * 8));
      auVar20._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar24._8_8_;
      auVar20._0_8_ = (ulong)((byte)uVar8 & 1) * auVar24._0_8_;
      auVar20._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar24._16_8_;
      auVar20._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar24._24_8_;
      uVar13 = uVar13 + 8;
      vpscatterqd_avx512f(ZEXT832(0) + auVar20,uVar8,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    } while ((uVar9 + 7 & 0xfffffff8) != uVar13);
  }
  local_50._0_4_ = i;
  if (i < 0) goto LAB_00148c6e;
  iVar14 = 0;
  piVar4 = *(int **)(pvec + (ulong)__lace_worker->worker * 8);
  uVar11 = uVar1 & 1;
  local_50 = (ulong)(uint)i;
  do {
    piVar16 = this->region;
    uVar15 = piVar16[local_50];
    if (0x80000000 < uVar15) {
      uVar2 = ((this->super_Solver).game)->_priority[local_50];
      if (this->to_inversion == false) {
        if (uVar2 != uVar1) goto joined_r0x00148c13;
      }
      else if ((uVar2 & 1) != uVar11) goto joined_r0x00148bad;
      if (iVar14 == 0) {
        piVar16[local_50] = r;
LAB_00148aae:
        this->winning[local_50] = uVar11;
        this->strategy[local_50] = -1;
        iVar3 = *piVar4;
        *piVar4 = iVar3 + 1;
        piVar4[(long)iVar3 + 1] = (int)local_50;
        if (__lace_worker->end == __lace_dq_head) {
          lace_abort_stack_overflow();
        }
        __lace_dq_head->f = attractParT_WRAP;
        (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
        *(uint *)__lace_dq_head->d = uVar11;
        *(int *)(__lace_dq_head->d + 4) = (int)local_50;
        *(int *)(__lace_dq_head->d + 8) = r;
        *(ZLKSolver **)(__lace_dq_head->d + 0x10) = this;
        pWVar5 = __lace_worker->_public;
        if (__lace_worker->allstolen == '\0') {
          if (pWVar5->movesplit != '\0') {
            uVar15 = (uint)((int)((ulong)((long)__lace_dq_head - (long)__lace_worker->dq) >> 6) + 2
                           + (int)((ulong)((long)__lace_worker->split - (long)__lace_worker->dq) >>
                                  6)) >> 1;
            LOCK();
            *(uint *)((long)&pWVar5->ts + 4) = uVar15;
            UNLOCK();
            __lace_worker->split = __lace_worker->dq + uVar15;
            pWVar5->movesplit = '\0';
          }
        }
        else {
          if (pWVar5->movesplit != '\0') {
            pWVar5->movesplit = '\0';
          }
          uVar13 = (long)__lace_dq_head - (long)__lace_worker->dq;
          LOCK();
          pWVar5->ts = (TailSplit)
                       ((uVar13 >> 6 & 0xffffffff | (uVar13 & 0xffffffffffffffc0) << 0x1a) +
                       0x100000000);
          UNLOCK();
          pWVar5->allstolen = '\0';
          __lace_worker->split = __lace_dq_head + 1;
          __lace_worker->allstolen = '\0';
        }
        __lace_dq_head = __lace_dq_head + 1;
        iVar14 = iVar14 + 1;
      }
      else {
        do {
          LOCK();
          bVar19 = uVar15 == piVar16[local_50];
          if (bVar19) {
            piVar16[local_50] = r;
          }
          UNLOCK();
          if (bVar19) {
            if (r != -0x7fffffff) goto LAB_00148aae;
            break;
          }
          piVar16 = this->region;
          uVar15 = piVar16[local_50];
        } while ((int)uVar15 < 0);
      }
    }
    bVar19 = 0 < (long)local_50;
    local_50 = local_50 - 1;
  } while (bVar19);
  local_50 = 0xffffffff;
joined_r0x00148c13:
  for (; iVar14 != 0; iVar14 = iVar14 + -1) {
    pTVar17 = __lace_dq_head + -1;
    if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= pTVar17)) {
      __lace_dq_head[-1].thief._M_b._M_p = (__pointer_type)0x0;
      attractParT(*(ZLKSolver **)(__lace_dq_head[-1].d + 0x10),__lace_worker,pTVar17,
                  *(int *)__lace_dq_head[-1].d,*(int *)(__lace_dq_head[-1].d + 4),
                  *(int *)(__lace_dq_head[-1].d + 8));
    }
    else {
      attractParT_SYNC_SLOW(__lace_worker,pTVar17);
    }
    __lace_dq_head = pTVar17;
  }
  goto LAB_00148c69;
joined_r0x00148bad:
  for (; iVar14 != 0; iVar14 = iVar14 + -1) {
    pTVar17 = __lace_dq_head + -1;
    if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= pTVar17)) {
      __lace_dq_head[-1].thief._M_b._M_p = (__pointer_type)0x0;
      attractParT(*(ZLKSolver **)(__lace_dq_head[-1].d + 0x10),__lace_worker,pTVar17,
                  *(int *)__lace_dq_head[-1].d,*(int *)(__lace_dq_head[-1].d + 4),
                  *(int *)(__lace_dq_head[-1].d + 8));
    }
    else {
      attractParT_SYNC_SLOW(__lace_worker,pTVar17);
    }
    __lace_dq_head = pTVar17;
  }
LAB_00148c69:
LAB_00148c6e:
  __n = (long)(R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start >> 2;
  if ((int)uVar9 < 1) {
    std::vector<int,_std::allocator<int>_>::reserve(R,__n);
  }
  else {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar24 = ZEXT864(__n);
    auVar23 = vpbroadcastq_avx512f();
    uVar13 = 0;
    do {
      auVar25 = vpbroadcastq_avx512f();
      auVar26 = vmovdqa64_avx512f(auVar24);
      auVar24 = vporq_avx512f(auVar25,auVar22);
      uVar8 = vpcmpuq_avx512f(auVar24,auVar23,2);
      vmovdqu64_avx512f(*(undefined1 (*) [64])(pvec + uVar13 * 8));
      uVar13 = uVar13 + 8;
      auVar20 = vpgatherqd_avx512f(*(undefined8 *)(ulong)uVar9);
      auVar21._4_4_ = (uint)((byte)(uVar8 >> 1) & 1) * auVar20._4_4_;
      auVar21._0_4_ = (uint)((byte)uVar8 & 1) * auVar20._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar8 >> 2) & 1) * auVar20._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar8 >> 3) & 1) * auVar20._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * auVar20._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * auVar20._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * auVar20._24_4_;
      auVar21._28_4_ = (uint)(byte)(uVar8 >> 7) * auVar20._28_4_;
      auVar24 = vpmovsxdq_avx512f(auVar21);
      auVar24 = vpaddq_avx512f(auVar26,auVar24);
    } while ((uVar9 + 7 & 0xfffffff8) != uVar13);
    auVar22 = vmovdqa64_avx512f(auVar24);
    bVar19 = (bool)((byte)uVar8 & 1);
    auVar23._0_8_ = (ulong)bVar19 * auVar22._0_8_ | (ulong)!bVar19 * auVar26._0_8_;
    bVar19 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar23._8_8_ = (ulong)bVar19 * auVar22._8_8_ | (ulong)!bVar19 * auVar26._8_8_;
    bVar19 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar23._16_8_ = (ulong)bVar19 * auVar22._16_8_ | (ulong)!bVar19 * auVar26._16_8_;
    bVar19 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar23._24_8_ = (ulong)bVar19 * auVar22._24_8_ | (ulong)!bVar19 * auVar26._24_8_;
    bVar19 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar23._32_8_ = (ulong)bVar19 * auVar22._32_8_ | (ulong)!bVar19 * auVar26._32_8_;
    bVar19 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar23._40_8_ = (ulong)bVar19 * auVar22._40_8_ | (ulong)!bVar19 * auVar26._40_8_;
    bVar19 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar23._48_8_ = (ulong)bVar19 * auVar22._48_8_ | (ulong)!bVar19 * auVar26._48_8_;
    auVar23._56_8_ = (uVar8 >> 7) * auVar22._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar26._56_8_;
    auVar20 = vextracti64x4_avx512f(auVar23,1);
    auVar22 = vpaddq_avx512f(auVar23,ZEXT3264(auVar20));
    auVar6 = vpaddq_avx(auVar22._0_16_,auVar22._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpaddq_avx(auVar6,auVar7);
    std::vector<int,_std::allocator<int>_>::reserve(R,auVar6._0_8_);
    if (0 < (int)uVar9) {
      puVar12 = (undefined8 *)0x0;
      do {
        piVar4 = *(int **)(pvec + (long)puVar12 * 8);
        if (0 < *piVar4) {
          lVar18 = 0;
          piVar16 = piVar4;
          do {
            piVar16 = piVar16 + 1;
            if (1 < (this->super_Solver).trace) {
              poVar10 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"attracted ",10);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,*piVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,((this->super_Solver).game)->_priority[*piVar16]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
              std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
            __position._M_current =
                 (R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish;
            if (__position._M_current ==
                (R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)R,__position,piVar16);
            }
            else {
              *__position._M_current = *piVar16;
              (R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish = __position._M_current + 1;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < *piVar4);
        }
        *piVar4 = 0;
        puVar12 = (undefined8 *)((long)puVar12 + 1);
      } while (puVar12 != (undefined8 *)(ulong)uVar9);
    }
  }
  return (int)local_50;
}

Assistant:

int
ZLKSolver::attractPar(WorkerP* __lace_worker, Task* __lace_dq_head, int i, int r, std::vector<int>* R)
{
    const int pr = priority(i);
    const int pl = pr & 1;

    // initialize pvec (set count to 0) for all workers
    const int W = lace_workers();
    for (int j=0; j<W; j++) pvec[j]->count = 0;

    par_helper* ours = pvec[LACE_WORKER_ID];
    int spawn_count = 0;

    for (; i>=0; i--) {
        int _r = region[i];
        if (_r == DIS or _r >= 0) continue; // not in subgame or attracted
        if (!to_inversion and priority(i) != pr) break;
        if ((priority(i)&1) != pl) { // search until parity inversion
            // first SYNC on all children, who knows this node may be attracted
            while (spawn_count) { SYNC(attractParT); spawn_count--; }
            // after SYNC, check if node <i> is now attracted.
            if (_r < 0) break; // not attracted, so we're done!
            else continue; // already done
        }

        // if c != 0, then we compete with attractParT and must use compare and swap
        if (spawn_count == 0) {
            region[i] = r; // just set, no competing threads
        } else {
            // competing threads! use compare and swap [in a loop]
            while (true) {
                if (__sync_bool_compare_and_swap(&region[i], _r, r)) {
                    _r = r;
                    break;
                }
                _r = *(volatile int*)&region[i];
                if (_r < 0) continue;
                _r = BOT;
                break;
            }
            if (_r == BOT) continue; // someone else claimed!
        }

        winning[i] = pl;
        strategy[i] = -1; // head nodes have no strategy (for now)
        ours->items[ours->count++] = i;
        SPAWN(attractParT, pl, i, r, this);
        spawn_count++;
    }

    // first SYNC on all children (if any)
    while (spawn_count) { SYNC(attractParT); spawn_count--; }

    // update R
    size_t to_reserve = R->size();
    for (int j=0; j<W; j++) to_reserve += pvec[j]->count;
    R->reserve(to_reserve);

    for (int j=0; j<W; j++) {
        par_helper* x = pvec[j];
        for (int k=0; k<x->count; k++) {
#ifndef NDEBUG
            if (trace >= 2) logger << "attracted " << x->items[k] << " (" << priority(x->items[k]) << ")" << std::endl;
#endif
            R->push_back(x->items[k]);
        }
        x->count = 0;
    }

    return i;
}